

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_HTML.h
# Opt level: O0

bool choc::html::HTMLElement::isCharLegal(uint32_t c)

{
  size_type sVar1;
  bool local_22;
  bool local_21;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  uint32_t local_c;
  uint32_t c_local;
  
  if ((((c < 0x61) || (local_21 = true, 0x7a < c)) && ((c < 0x41 || (local_21 = true, 0x5a < c))))
     && ((c < 0x30 || (local_21 = true, 0x39 < c)))) {
    local_22 = false;
    if (c < 0x7f) {
      local_c = c;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_20," .,;:-()_+=?!$#@[]/|*%~{}\\");
      sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::find(&local_20,(char)local_c,0)
      ;
      local_22 = sVar1 != 0xffffffffffffffff;
    }
    local_21 = local_22;
  }
  return local_21;
}

Assistant:

static bool isCharLegal (uint32_t c)
    {
        return (c >= 'a' && c <= 'z')
            || (c >= 'A' && c <= 'Z')
            || (c >= '0' && c <= '9')
            || (c < 127 && std::string_view (" .,;:-()_+=?!$#@[]/|*%~{}\\").find ((char) c) != std::string_view::npos);
    }